

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O1

bool iDynTree::exportXMLBlob(string *xmlBlob,xmlNodePtr parent_element)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  char *__s;
  int iVar4;
  size_t sVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  xmlNodePtr new_node;
  long local_38;
  
  local_38 = 0;
  pbVar8 = (byte *)(xmlBlob->_M_dataplus)._M_p;
  uVar3 = xmlBlob->_M_string_length;
  pbVar1 = pbVar8 + uVar3;
  pbVar6 = pbVar8;
  if (0 < (long)uVar3 >> 2) {
    pbVar6 = pbVar8 + (uVar3 & 0xfffffffffffffffc);
    lVar7 = ((long)uVar3 >> 2) + 1;
    pbVar8 = pbVar8 + 3;
    do {
      iVar4 = isprint((uint)pbVar8[-3]);
      if (iVar4 == 0) {
        pbVar8 = pbVar8 + -3;
        goto LAB_001280d1;
      }
      iVar4 = isprint((uint)pbVar8[-2]);
      if (iVar4 == 0) {
        pbVar8 = pbVar8 + -2;
        goto LAB_001280d1;
      }
      iVar4 = isprint((uint)pbVar8[-1]);
      if (iVar4 == 0) {
        pbVar8 = pbVar8 + -1;
        goto LAB_001280d1;
      }
      iVar4 = isprint((uint)*pbVar8);
      if (iVar4 == 0) goto LAB_001280d1;
      lVar7 = lVar7 + -1;
      pbVar8 = pbVar8 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar1 - (long)pbVar6;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pbVar8 = pbVar1;
      if ((lVar7 != 3) || (iVar4 = isprint((uint)*pbVar6), pbVar8 = pbVar6, iVar4 == 0))
      goto LAB_001280d1;
      pbVar6 = pbVar6 + 1;
    }
    iVar4 = isprint((uint)*pbVar6);
    pbVar8 = pbVar6;
    if (iVar4 == 0) goto LAB_001280d1;
    pbVar6 = pbVar6 + 1;
  }
  iVar4 = isprint((uint)*pbVar6);
  pbVar8 = pbVar6;
  if (iVar4 != 0) {
    pbVar8 = pbVar1;
  }
LAB_001280d1:
  pbVar6 = pbVar8 + 1;
  if (pbVar6 != pbVar1 && pbVar8 != pbVar1) {
    do {
      bVar2 = *pbVar6;
      iVar4 = isprint((uint)bVar2);
      if (iVar4 != 0) {
        *pbVar8 = bVar2;
        pbVar8 = pbVar8 + 1;
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar1);
  }
  xmlBlob->_M_string_length = (long)pbVar8 - (long)(xmlBlob->_M_dataplus)._M_p;
  *pbVar8 = 0;
  __s = (xmlBlob->_M_dataplus)._M_p;
  sVar5 = strlen(__s);
  xmlParseInNodeContext(parent_element,__s,sVar5 & 0xffffffff,0,&local_38);
  if (local_38 != 0) {
    xmlAddChild(parent_element);
  }
  return true;
}

Assistant:

bool exportXMLBlob(std::string xmlBlob, xmlNodePtr parent_element) {
     xmlNodePtr new_node = nullptr;
     // Let's remove non printable characters
     xmlBlob.erase(std::remove_if(xmlBlob.begin(), xmlBlob.end(),
         [](unsigned char c) {
             return !std::isprint(c);
         }),
         xmlBlob.end());
    // we assume that 'parent_element' node is already defined
    xmlParseInNodeContext(parent_element, xmlBlob.c_str(), strlen(xmlBlob.c_str()), 0, &new_node);
    if (new_node) xmlAddChild(parent_element, new_node);
    return true;
}